

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O3

void __thiscall
QAnimationGroup::removeAnimation(QAnimationGroup *this,QAbstractAnimation *animation)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  int index;
  long lVar4;
  
  if (animation == (QAbstractAnimation *)0x0) {
    removeAnimation();
  }
  else {
    lVar3 = *(long *)(*(long *)(this + 8) + 0xb0);
    if (lVar3 != 0) {
      index = -1;
      lVar4 = 0;
      do {
        if (lVar3 << 3 == lVar4) goto LAB_003a78fe;
        index = index + 1;
        lVar1 = lVar4 + 8;
        plVar2 = (long *)(*(long *)(*(long *)(this + 8) + 0xa8) + lVar4);
        lVar4 = lVar1;
      } while ((QAbstractAnimation *)*plVar2 != animation);
      if (lVar1 != 0) {
        takeAnimation(this,index);
        return;
      }
    }
LAB_003a78fe:
    removeAnimation();
  }
  return;
}

Assistant:

void QAnimationGroup::removeAnimation(QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (!animation) {
        qWarning("QAnimationGroup::remove: cannot remove null animation");
        return;
    }
    qsizetype index = d->animations.indexOf(animation);
    if (index == -1) {
        qWarning("QAnimationGroup::remove: animation is not part of this group");
        return;
    }

    takeAnimation(index);
}